

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_iterator_suite.cpp
# Opt level: O0

void reverse_iterator_suite::iterate_string(void)

{
  index_type *piVar1;
  bool bVar2;
  type tVar3;
  pointer this;
  reference lhs;
  pointer ptVar4;
  reference pbVar5;
  reverse_iterator local_190;
  reverse_iterator local_178;
  undefined1 local_160 [8];
  const_reverse_iterator where_2;
  variable data_2;
  const_reverse_iterator local_110;
  const_reverse_iterator local_f8;
  undefined1 local_e0 [8];
  const_reverse_iterator where_1;
  variable data_1;
  reverse_iterator local_90;
  reverse_iterator local_78;
  undefined1 local_50 [8];
  reverse_iterator where;
  variable data;
  
  piVar1 = &where.current.
            super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
            .current.current;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)piVar1,"alpha");
  trial::dynamic::basic_variable<std::allocator<char>_>::rbegin
            ((reverse_iterator *)local_50,(basic_variable<std::allocator<char>_> *)piVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::rend
            (&local_78,
             (basic_variable<std::allocator<char>_> *)
             &where.current.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  bVar2 = std::operator!=((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::iterator>
                           *)local_50,&local_78);
  boost::detail::test_impl
            ("where != data.rend()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xa51,"void reverse_iterator_suite::iterate_string()",bVar2);
  std::reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::iterator>::
  ~reverse_iterator(&local_78);
  this = std::reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::iterator>::
         operator->((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::iterator>
                     *)local_50);
  bVar2 = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::string>(this);
  boost::detail::test_impl
            ("where->is<string>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xa52,"void reverse_iterator_suite::iterate_string()",bVar2);
  lhs = std::reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::iterator>::
        operator*((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::iterator>
                   *)local_50);
  tVar3 = trial::dynamic::operator==(lhs,(char (*) [6])"alpha");
  boost::detail::test_impl
            ("*where == \"alpha\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xa53,"void reverse_iterator_suite::iterate_string()",tVar3);
  std::reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::iterator>::operator++
            ((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::iterator> *)
             local_50);
  trial::dynamic::basic_variable<std::allocator<char>_>::rend
            (&local_90,
             (basic_variable<std::allocator<char>_> *)
             &where.current.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  bVar2 = std::operator==((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::iterator>
                           *)local_50,&local_90);
  boost::detail::test_impl
            ("where == data.rend()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xa55,"void reverse_iterator_suite::iterate_string()",bVar2);
  std::reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::iterator>::
  ~reverse_iterator(&local_90);
  std::reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::iterator>::
  ~reverse_iterator((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::iterator>
                     *)local_50);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)
             &where.current.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  piVar1 = &where_1.current.
            super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
            .current.current;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)piVar1,"alpha");
  trial::dynamic::basic_variable<std::allocator<char>_>::rbegin
            ((const_reverse_iterator *)local_e0,(basic_variable<std::allocator<char>_> *)piVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::rend
            (&local_f8,
             (basic_variable<std::allocator<char>_> *)
             &where_1.current.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  bVar2 = std::operator!=((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>
                           *)local_e0,&local_f8);
  boost::detail::test_impl
            ("where != data.rend()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xa5a,"void reverse_iterator_suite::iterate_string()",bVar2);
  std::reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>::
  ~reverse_iterator(&local_f8);
  ptVar4 = std::
           reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>::
           operator->((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>
                       *)local_e0);
  bVar2 = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::string>(ptVar4);
  boost::detail::test_impl
            ("where->is<string>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xa5b,"void reverse_iterator_suite::iterate_string()",bVar2);
  pbVar5 = std::
           reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>::
           operator*((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>
                      *)local_e0);
  tVar3 = trial::dynamic::operator==(pbVar5,(char (*) [6])"alpha");
  boost::detail::test_impl
            ("*where == \"alpha\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xa5c,"void reverse_iterator_suite::iterate_string()",tVar3);
  std::reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>::
  operator++((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>
              *)local_e0);
  trial::dynamic::basic_variable<std::allocator<char>_>::rend
            (&local_110,
             (basic_variable<std::allocator<char>_> *)
             &where_1.current.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  bVar2 = std::operator==((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>
                           *)local_e0,&local_110);
  boost::detail::test_impl
            ("where == data.rend()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xa5e,"void reverse_iterator_suite::iterate_string()",bVar2);
  std::reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>::
  ~reverse_iterator(&local_110);
  std::reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>::
  ~reverse_iterator((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>
                     *)local_e0);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)
             &where_1.current.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  piVar1 = &where_2.current.
            super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
            .current.current;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)piVar1,"alpha");
  trial::dynamic::basic_variable<std::allocator<char>_>::crbegin
            ((const_reverse_iterator *)local_160,(basic_variable<std::allocator<char>_> *)piVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::rend
            (&local_178,
             (basic_variable<std::allocator<char>_> *)
             &where_2.current.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  bVar2 = std::operator!=((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>
                           *)local_160,&local_178);
  boost::detail::test_impl
            ("where != data.rend()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xa63,"void reverse_iterator_suite::iterate_string()",bVar2);
  std::reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::iterator>::
  ~reverse_iterator(&local_178);
  ptVar4 = std::
           reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>::
           operator->((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>
                       *)local_160);
  bVar2 = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::string>(ptVar4);
  boost::detail::test_impl
            ("where->is<string>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xa64,"void reverse_iterator_suite::iterate_string()",bVar2);
  pbVar5 = std::
           reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>::
           operator*((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>
                      *)local_160);
  tVar3 = trial::dynamic::operator==(pbVar5,(char (*) [6])"alpha");
  boost::detail::test_impl
            ("*where == \"alpha\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xa65,"void reverse_iterator_suite::iterate_string()",tVar3);
  std::reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>::
  operator++((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>
              *)local_160);
  trial::dynamic::basic_variable<std::allocator<char>_>::rend
            (&local_190,
             (basic_variable<std::allocator<char>_> *)
             &where_2.current.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  bVar2 = std::operator==((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>
                           *)local_160,&local_190);
  boost::detail::test_impl
            ("where == data.rend()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xa67,"void reverse_iterator_suite::iterate_string()",bVar2);
  std::reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::iterator>::
  ~reverse_iterator(&local_190);
  std::reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>::
  ~reverse_iterator((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>
                     *)local_160);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)
             &where_2.current.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  return;
}

Assistant:

void iterate_string()
{
    {
        variable data("alpha");
        variable::reverse_iterator where = data.rbegin();
        TRIAL_PROTOCOL_TEST(where != data.rend());
        TRIAL_PROTOCOL_TEST(where->is<string>());
        TRIAL_PROTOCOL_TEST(*where == "alpha");
        ++where;
        TRIAL_PROTOCOL_TEST(where == data.rend());
    }
    {
        const variable data("alpha");
        variable::const_reverse_iterator where = data.rbegin();
        TRIAL_PROTOCOL_TEST(where != data.rend());
        TRIAL_PROTOCOL_TEST(where->is<string>());
        TRIAL_PROTOCOL_TEST(*where == "alpha");
        ++where;
        TRIAL_PROTOCOL_TEST(where == data.rend());
    }
    {
        variable data("alpha");
        variable::const_reverse_iterator where = data.crbegin();
        TRIAL_PROTOCOL_TEST(where != data.rend());
        TRIAL_PROTOCOL_TEST(where->is<string>());
        TRIAL_PROTOCOL_TEST(*where == "alpha");
        ++where;
        TRIAL_PROTOCOL_TEST(where == data.rend());
    }
}